

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void __thiscall
spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,SPIRConstant **vector_elements,
          uint32_t num_elements,bool specialized)

{
  undefined8 *puVar1;
  SPIRConstant *pSVar2;
  Constant CVar3;
  Constant CVar4;
  Constant CVar5;
  Constant CVar6;
  undefined8 uVar7;
  ConstantMatrix *pCVar8;
  ulong uVar9;
  long lVar10;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_003fd288;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  pCVar8 = &this->m;
  lVar10 = 0;
  do {
    puVar1 = (undefined8 *)((long)&(this->m).c[0].id[0].id + lVar10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)((this->m).c[0].id + 4) + lVar10) = 1;
    puVar1 = (undefined8 *)((long)(this->m).c[0].r + lVar10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m).c[0].r + lVar10 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar10 = lVar10 + 0x38;
  } while (lVar10 != 0xe0);
  (this->m).id[0] = 0;
  (this->m).id[1] = 0;
  (this->m).id[2] = 0;
  (this->m).id[3] = 0;
  (this->m).columns = 1;
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)0x0;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size =
       0;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)&(this->subconstants).stack_storage;
  (this->subconstants).buffer_capacity = 8;
  (this->specialization_constant_macro_name)._M_dataplus._M_p =
       (pointer)&(this->specialization_constant_macro_name).field_2;
  (this->specialization_constant_macro_name)._M_string_length = 0;
  (this->specialization_constant_macro_name).field_2._M_local_buf[0] = '\0';
  if (((*vector_elements)->m).c[0].vecsize < 2) {
    (this->m).c[0].vecsize = num_elements;
    (this->m).columns = 1;
    if (num_elements != 0) {
      uVar9 = 0;
      do {
        (this->m).c[0].r[uVar9] = (vector_elements[uVar9]->m).c[0].r[0];
        if (vector_elements[uVar9]->specialization == true) {
          (this->m).c[0].id[uVar9].id = (vector_elements[uVar9]->super_IVariant).self.id;
        }
        uVar9 = uVar9 + 1;
      } while (num_elements != uVar9);
    }
  }
  else {
    (this->m).columns = num_elements;
    if (num_elements != 0) {
      uVar9 = 0;
      do {
        pSVar2 = vector_elements[uVar9];
        pCVar8->c[0].vecsize = (pSVar2->m).c[0].vecsize;
        CVar3 = (pSVar2->m).c[0].r[0];
        CVar4 = (pSVar2->m).c[0].r[1];
        CVar5 = (pSVar2->m).c[0].r[2];
        CVar6 = (pSVar2->m).c[0].r[3];
        uVar7 = *(undefined8 *)((pSVar2->m).c[0].id + 2);
        *(undefined8 *)pCVar8->c[0].id = *(undefined8 *)(pSVar2->m).c[0].id;
        *(undefined8 *)(pCVar8->c[0].id + 2) = uVar7;
        pCVar8->c[0].r[2] = CVar5;
        pCVar8->c[0].r[3] = CVar6;
        pCVar8->c[0].r[0] = CVar3;
        pCVar8->c[0].r[1] = CVar4;
        if (vector_elements[uVar9]->specialization == true) {
          (this->m).id[uVar9].id = (vector_elements[uVar9]->super_IVariant).self.id;
        }
        uVar9 = uVar9 + 1;
        pCVar8 = (ConstantMatrix *)(pCVar8->c + 1);
      } while (num_elements != uVar9);
    }
  }
  return;
}

Assistant:

TypedID(uint32_t id_)
	    : id(id_)
	{
	}